

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBoolean.cpp
# Opt level: O1

Var Js::JavascriptBoolean::EntryToString(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  Var pvVar6;
  JavascriptBoolean *pJVar7;
  JavascriptBooleanObject *this;
  JavascriptString *pJVar8;
  Type *this_00;
  int in_stack_00000010;
  undefined1 local_30 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBoolean.cpp"
                                ,0x5d,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bc2445;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_30 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_30,(CallInfo *)&args.super_Arguments.Values);
  if (((ulong)local_30 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBoolean.cpp"
                                ,0x5e,"(args.Info.Count)","Should always have implicit \'this\'.");
    if (!bVar3) goto LAB_00bc2445;
    *puVar5 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBoolean.cpp"
                                ,0x61,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00bc2445:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pvVar6 = Arguments::operator[]((Arguments *)local_30,0);
  bVar3 = VarIs<Js::JavascriptBoolean>(pvVar6);
  if (bVar3) {
    pJVar7 = VarTo<Js::JavascriptBoolean>(pvVar6);
    iVar4 = pJVar7->value;
  }
  else {
    bVar3 = VarIs<Js::JavascriptBooleanObject>(pvVar6);
    if (!bVar3) {
      pvVar6 = TryInvokeRemotelyOrThrow
                         (EntryToString,pSVar1,(Arguments *)local_30,-0x7ff5ec3e,
                          L"Boolean.prototype.toString");
      return pvVar6;
    }
    this = VarTo<Js::JavascriptBooleanObject>(pvVar6);
    iVar4 = JavascriptBooleanObject::GetValue(this);
  }
  this_00 = &((pSVar1->super_ScriptContextBase).javascriptLibrary)->stringCache;
  if (iVar4 == 0) {
    pJVar8 = StringCache::GetFalseDisplay(this_00);
  }
  else {
    pJVar8 = StringCache::GetTrueDisplay(this_00);
  }
  return pJVar8;
}

Assistant:

Var JavascriptBoolean::EntryToString(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count, "Should always have implicit 'this'.");
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        BOOL bval;
        Var aValue = args[0];
        if(VarIs<JavascriptBoolean>(aValue))
        {
            bval = VarTo<JavascriptBoolean>(aValue)->GetValue();
        }
        else if (VarIs<JavascriptBooleanObject>(aValue))
        {
            JavascriptBooleanObject* booleanObject = VarTo<JavascriptBooleanObject>(aValue);
            bval = booleanObject->GetValue();
        }
        else
        {
            return TryInvokeRemotelyOrThrow(EntryToString, scriptContext, args, JSERR_This_NeedBoolean, _u("Boolean.prototype.toString"));
        }

        return bval ? scriptContext->GetLibrary()->GetTrueDisplayString() : scriptContext->GetLibrary()->GetFalseDisplayString();
    }